

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.h
# Opt level: O0

void __thiscall dlib::fatal_error::check_for_previous_fatal_errors(fatal_error *this)

{
  ostream *poVar1;
  char *pcVar2;
  ulong uVar3;
  char *pcVar4;
  long *in_RDI;
  bool bVar5;
  unsigned_long i;
  char *msg;
  ulong local_18;
  
  if (!check_for_previous_fatal_errors::is_first_fatal_error) {
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "\n\n ************************** FATAL ERROR DETECTED ************************** "
                            );
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             " ************************** FATAL ERROR DETECTED ************************** "
                            );
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             " ************************** FATAL ERROR DETECTED ************************** \n"
                            );
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "Two fatal errors have been detected, the first was inappropriately ignored. \n"
                            );
    poVar1 = std::operator<<(poVar1,
                             "To prevent further fatal errors from being ignored this application will be \n"
                            );
    poVar1 = std::operator<<(poVar1,
                             "terminated immediately and you should go fix this buggy program.\n\n")
    ;
    poVar1 = std::operator<<(poVar1,"The error message from this fatal error was:\n");
    pcVar2 = (char *)(**(code **)(*in_RDI + 0x10))();
    poVar1 = std::operator<<(poVar1,pcVar2);
    poVar1 = std::operator<<(poVar1,"\n\n");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    abort();
  }
  pcVar2 = message();
  local_18 = 0;
  while( true ) {
    bVar5 = false;
    if (local_18 < 1999) {
      uVar3 = std::__cxx11::string::size();
      bVar5 = local_18 < uVar3;
    }
    if (!bVar5) break;
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)(in_RDI + 1));
    pcVar2[local_18] = *pcVar4;
    local_18 = local_18 + 1;
  }
  pcVar2[local_18] = '\0';
  std::set_terminate(dlib_fatal_error_terminate);
  check_for_previous_fatal_errors::is_first_fatal_error = false;
  return;
}

Assistant:

void check_for_previous_fatal_errors()
        {
            // If dlib is being use to create plugins for some other application, like
            // MATLAB, then don't do these checks since it terminates the over arching
            // system.  Just let the errors go to the plugin handler and it will deal with
            // them.
#if defined(MATLAB_MEX_FILE) || defined(DLIB_NO_ABORT_ON_2ND_FATAL_ERROR)
            return;
#else
            static bool is_first_fatal_error = true;
            if (is_first_fatal_error == false)
            {
                std::cerr << "\n\n ************************** FATAL ERROR DETECTED ************************** " << std::endl;
                std::cerr << " ************************** FATAL ERROR DETECTED ************************** " << std::endl;
                std::cerr << " ************************** FATAL ERROR DETECTED ************************** \n" << std::endl;
                std::cerr << "Two fatal errors have been detected, the first was inappropriately ignored. \n"
                          << "To prevent further fatal errors from being ignored this application will be \n"
                          << "terminated immediately and you should go fix this buggy program.\n\n"
                          << "The error message from this fatal error was:\n" << this->what() << "\n\n" << std::endl;
                assert(false);
                abort();
            }
            else
            {
                // copy the message into the fixed message buffer so that it can be recalled by dlib_fatal_error_terminate
                // if needed.
                char* msg = message();
                unsigned long i;
                for (i = 0; i < 2000-1 && i < this->info.size(); ++i)
                    msg[i] = info[i];
                msg[i] = '\0';

                // set this termination handler so that if the user doesn't catch this dlib::fatal_error that is being
                // thrown then it will eventually be printed to standard error
                std::set_terminate(&dlib_fatal_error_terminate);
            }
            is_first_fatal_error = false;
#endif
        }